

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O0

REF_STATUS ref_sort_search_dbl(REF_INT n,REF_DBL *ascending_list,REF_DBL target,REF_INT *position)

{
  int local_34;
  int local_30;
  REF_INT mid;
  REF_INT upper;
  REF_INT lower;
  REF_INT *position_local;
  REF_DBL target_local;
  REF_DBL *ascending_list_local;
  REF_INT n_local;
  
  *position = -1;
  if (n < 1) {
    ascending_list_local._4_4_ = 5;
  }
  else if (n == 1) {
    *position = 0;
    ascending_list_local._4_4_ = 0;
  }
  else if (*ascending_list < target) {
    if (target < ascending_list[n + -1]) {
      mid = 0;
      local_30 = n + -2;
      local_34 = local_30 >> 1;
      if ((target < ascending_list[local_34]) || (ascending_list[local_34 + 1] <= target)) {
        while (mid < local_30) {
          if ((ascending_list[mid] <= target) && (target < ascending_list[mid + 1])) {
            *position = mid;
            return 0;
          }
          if ((ascending_list[local_30] <= target) && (target < ascending_list[local_30 + 1])) {
            *position = local_30;
            return 0;
          }
          if ((ascending_list[local_34] <= target) && (target < ascending_list[local_34 + 1])) {
            *position = local_34;
            return 0;
          }
          if (target < ascending_list[local_34]) {
            local_30 = local_34;
          }
          else {
            mid = local_34;
          }
          local_34 = mid + local_30 >> 1;
        }
        ascending_list_local._4_4_ = 1;
      }
      else {
        *position = local_34;
        ascending_list_local._4_4_ = 0;
      }
    }
    else {
      *position = n + -2;
      ascending_list_local._4_4_ = 0;
    }
  }
  else {
    *position = 0;
    ascending_list_local._4_4_ = 0;
  }
  return ascending_list_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_sort_search_dbl(REF_INT n, REF_DBL *ascending_list,
                                       REF_DBL target, REF_INT *position) {
  REF_INT lower, upper, mid;

  *position = REF_EMPTY;

  /* printf("n %d target %f [",n,target);
   * for(mid=0;mid<n;mid++)printf(" %f",ascending_list[mid]);
   * printf(" ]\n"); */

  if (n < 1) return REF_NOT_FOUND;
  if (n == 1) {
    *position = 0;
    return REF_SUCCESS;
  }
  if (target <= ascending_list[0]) {
    *position = 0;
    return REF_SUCCESS;
  }
  if (target >= ascending_list[n - 1]) {
    *position = n - 2;
    return REF_SUCCESS;
  }

  lower = 0;
  upper = n - 2;
  mid = (lower + upper) >> 1; /* fast divide by two */

  if (ascending_list[mid] <= target && target < ascending_list[mid + 1]) {
    *position = mid;
    return REF_SUCCESS;
  }

  while (lower < upper) {
    if (ascending_list[lower] <= target && target < ascending_list[lower + 1]) {
      *position = lower;
      return REF_SUCCESS;
    }
    if (ascending_list[upper] <= target && target < ascending_list[upper + 1]) {
      *position = upper;
      return REF_SUCCESS;
    }
    if (ascending_list[mid] <= target && target < ascending_list[mid + 1]) {
      *position = mid;
      return REF_SUCCESS;
    }
    if (target >= ascending_list[mid]) {
      lower = mid;
    } else {
      upper = mid;
    }
    mid = (lower + upper) >> 1;
  }

  return REF_FAILURE;
}